

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-actions.h
# Opt level: O0

void __thiscall
testing::
Action<const_std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_&()>::
Action(Action<const_std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_&()>
       *this,ActionInterface<const_std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_&()>
             *impl)

{
  ActionAdapter local_28;
  ActionInterface<const_std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_&()>
  *local_18;
  ActionInterface<const_std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_&()>
  *impl_local;
  Action<const_std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_&()>
  *this_local;
  
  local_18 = impl;
  impl_local = (ActionInterface<const_std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_&()>
                *)this;
  std::
  shared_ptr<testing::ActionInterface<std::vector<solitaire::cards::Card,std::allocator<solitaire::cards::Card>>const&()>>
  ::
  shared_ptr<testing::ActionInterface<std::vector<solitaire::cards::Card,std::allocator<solitaire::cards::Card>>const&()>,void>
            ((shared_ptr<testing::ActionInterface<std::vector<solitaire::cards::Card,std::allocator<solitaire::cards::Card>>const&()>>
              *)&local_28,impl);
  std::function<std::vector<solitaire::cards::Card,std::allocator<solitaire::cards::Card>>const&()>
  ::
  function<testing::Action<std::vector<solitaire::cards::Card,std::allocator<solitaire::cards::Card>>const&()>::ActionAdapter,void>
            ((function<std::vector<solitaire::cards::Card,std::allocator<solitaire::cards::Card>>const&()>
              *)this,&local_28);
  ActionAdapter::~ActionAdapter(&local_28);
  return;
}

Assistant:

explicit Action(ActionInterface<F>* impl)
      : fun_(ActionAdapter{::std::shared_ptr<ActionInterface<F>>(impl)}) {}